

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateWarmStart_Test::~OsqpTest_GetAndUpdateWarmStart_Test
          (OsqpTest_GetAndUpdateWarmStart_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateWarmStart) {
  OsqpSettings settings;
  settings.warm_start = false;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto warm_start = solver.GetWarmStart();
    ASSERT_TRUE(warm_start.ok());
    EXPECT_FALSE(*warm_start);
  }

  ASSERT_TRUE(solver.UpdateWarmStart(true).ok());
  {
    const auto warm_start = solver.GetWarmStart();
    ASSERT_TRUE(warm_start.ok());
    EXPECT_TRUE(*warm_start);
  }
}